

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ptrdiff_t _Num;
  size_t __n;
  undefined1 auStack_38 [32];
  
  uVar6 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  __n = (size_t)iVar1;
  puVar4 = auStack_38 + __n;
  uVar7 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar7 / 100;
      *(undefined2 *)(puVar4 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar7 + (int)uVar6 * -100) * 2)
      ;
      puVar4 = puVar4 + -2;
      bVar2 = 9999 < uVar7;
      uVar7 = uVar6;
    } while (bVar2);
  }
  __dest = *it;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar3 = -1;
  }
  else {
    puVar4[-1] = internal::basic_data<void>::DIGITS[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[uVar6 * 2 & 0x1fffffffe];
    lVar3 = -2;
  }
  puVar4[lVar3] = bVar5;
  if (iVar1 != 0) {
    memcpy(__dest,auStack_38,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }